

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DifferentialTest.h
# Opt level: O2

bool ProcessDifferentials<Blob<64>>
               (vector<Blob<64>,_std::allocator<Blob<64>_>_> *diffs,int reps,bool dumpCollisions)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  Blob<64> *pBVar5;
  Blob<64> *pBVar6;
  long lVar7;
  int i;
  long lVar8;
  Blob<64> kp;
  
  std::
  __sort<__gnu_cxx::__normal_iterator<Blob<64>*,std::vector<Blob<64>,std::allocator<Blob<64>>>>,__gnu_cxx::__ops::_Iter_less_iter>
            ((diffs->super__Vector_base<Blob<64>,_std::allocator<Blob<64>_>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (diffs->super__Vector_base<Blob<64>,_std::allocator<Blob<64>_>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  pBVar6 = (diffs->super__Vector_base<Blob<64>,_std::allocator<Blob<64>_>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pBVar5 = (diffs->super__Vector_base<Blob<64>,_std::allocator<Blob<64>_>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pBVar5 == pBVar6) {
    uVar4 = 0;
    bVar2 = true;
    pBVar6 = pBVar5;
  }
  else {
    Blob<64>::Blob(&kp,pBVar6);
    iVar3 = 1;
    uVar4 = 0;
    bVar2 = true;
    lVar8 = 1;
    lVar7 = 8;
    while( true ) {
      pBVar5 = (diffs->super__Vector_base<Blob<64>,_std::allocator<Blob<64>_>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      pBVar6 = (diffs->super__Vector_base<Blob<64>,_std::allocator<Blob<64>_>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((int)((ulong)((long)pBVar5 - (long)pBVar6) >> 3) <= lVar8) break;
      bVar1 = Blob<64>::operator==((Blob<64> *)(pBVar6->bytes + lVar7),&kp);
      if (bVar1) {
        iVar3 = iVar3 + 1;
      }
      else {
        if (iVar3 < 2) {
          uVar4 = uVar4 + 1;
        }
        else {
          if (dumpCollisions) {
            printbits(&kp,8);
            printf(" - %4.2f%%\n",((double)iVar3 / (double)reps) * 100.0);
          }
          bVar2 = false;
        }
        Blob<64>::operator=(&kp,(Blob<64> *)
                                (((diffs->super__Vector_base<Blob<64>,_std::allocator<Blob<64>_>_>).
                                  _M_impl.super__Vector_impl_data._M_start)->bytes + lVar7));
        iVar3 = 1;
      }
      lVar8 = lVar8 + 1;
      lVar7 = lVar7 + 8;
    }
    if (iVar3 < 2) {
      uVar4 = uVar4 + 1;
    }
    else if (dumpCollisions) {
      printbits(&kp,8);
      printf(" - %4.2f%%\n",((double)iVar3 / (double)reps) * 100.0);
      pBVar6 = (diffs->super__Vector_base<Blob<64>,_std::allocator<Blob<64>_>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pBVar5 = (diffs->super__Vector_base<Blob<64>,_std::allocator<Blob<64>_>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    }
  }
  printf("%d total collisions, of which %d single collisions were ignored",
         (ulong)((long)pBVar5 - (long)pBVar6) >> 3,(ulong)uVar4);
  if (!bVar2) {
    printf(" !!!!!");
  }
  puts("\n");
  return bVar2;
}

Assistant:

bool ProcessDifferentials ( std::vector<keytype> & diffs, int reps, bool dumpCollisions )
{
  std::sort(diffs.begin(), diffs.end());

  int count = 1;
  int ignore = 0;

  bool result = true;

  if(diffs.size())
  {
    keytype kp = diffs[0];

    for(int i = 1; i < (int)diffs.size(); i++)
    {
      if(diffs[i] == kp)
      {
        count++;
        continue;
      }
      else
      {
        if(count > 1)
        {
          result = false;

          double pct = 100 * (double(count) / double(reps));

          if(dumpCollisions)
          {
            printbits((unsigned char*)&kp,sizeof(kp));
            printf(" - %4.2f%%\n", pct );
          }
        }
        else 
        {
          ignore++;
        }

        kp = diffs[i];
        count = 1;
      }
    }

    if(count > 1)
    {
      double pct = 100 * (double(count) / double(reps));

      if(dumpCollisions)
      {
        printbits((unsigned char*)&kp,sizeof(kp));
        printf(" - %4.2f%%\n", pct );
      }
    }
    else 
    {
      ignore++;
    }
  }

  printf("%d total collisions, of which %d single collisions were ignored",
         (int)diffs.size(),ignore);

  if(result == false)
  {
    printf(" !!!!!");
  }

  printf("\n\n");

  return result;
}